

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O3

void mtree_indent(mtree_writer *mtree)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  char *__s;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  archive_string *paVar10;
  uint uVar11;
  int iVar12;
  
  iVar2 = 0;
  if (mtree->classic == 0) {
    uVar11 = 0;
  }
  else if (mtree->indent == 0) {
    uVar11 = (uint)(mtree->depth != 0) << 2;
  }
  else {
    iVar2 = mtree->depth << 2;
    uVar11 = 0;
  }
  __s = (mtree->ebuf).s;
  pcVar7 = __s + -1;
  do {
    pcVar3 = pcVar7 + 1;
    pcVar7 = pcVar7 + 1;
  } while (*pcVar3 == ' ');
  pcVar3 = strchr(pcVar7,0x20);
  pcVar7 = (char *)0x0;
  if (pcVar3 != (char *)0x0) {
    paVar10 = &mtree->buf;
    iVar12 = iVar2 + 0xf;
    if (iVar2 + 0xf < 1) {
      iVar12 = 0;
    }
    bVar1 = false;
    pcVar8 = pcVar7;
    pcVar4 = pcVar3;
    do {
      pcVar7 = pcVar4;
      if (bVar1) {
        if (0x3e < (long)(pcVar7 + ((long)iVar2 - (long)__s))) {
          if (pcVar8 != (char *)0x0) {
            pcVar7 = pcVar8;
          }
          archive_strncat(paVar10,__s,(long)pcVar7 - (long)__s);
          archive_strncat(paVar10," \\\n",3);
          iVar6 = iVar12 + 1;
          if (-0x10 < iVar2) {
            do {
              archive_strappend_char(paVar10,' ');
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
          goto LAB_004232e8;
        }
        pcVar8 = pcVar7 + 1;
      }
      else {
        iVar6 = iVar2 + uVar11;
        if (0 < (int)(iVar2 + uVar11)) {
          do {
            archive_strappend_char(paVar10,' ');
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
        }
        archive_strncat(paVar10,__s,(long)pcVar7 - (long)__s);
        lVar9 = ((long)pcVar7 - (long)__s) + (ulong)uVar11;
        if (lVar9 < 0x10) {
          if ((int)lVar9 < 0x10) {
            iVar6 = ((uVar11 - 1) + (int)pcVar7) - (int)__s;
            do {
              archive_strappend_char(paVar10,' ');
              iVar6 = iVar6 + 1;
            } while (iVar6 < 0xf);
          }
        }
        else {
          archive_strncat(paVar10," \\\n",3);
          iVar6 = iVar12 + 1;
          if (-0x10 < iVar2) {
            do {
              archive_strappend_char(paVar10,' ');
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
        }
LAB_004232e8:
        __s = pcVar7 + 1;
        pcVar7 = (char *)0x0;
        pcVar8 = __s;
      }
      pcVar4 = strchr(pcVar8,0x20);
      bVar1 = true;
      pcVar8 = pcVar7;
    } while (pcVar4 != (char *)0x0);
    if (pcVar3 != (char *)0x0) goto LAB_00423351;
  }
  iVar12 = uVar11 + iVar2;
  if (iVar12 != 0 && SCARRY4(uVar11,iVar2) == iVar12 < 0) {
    do {
      archive_strappend_char(&mtree->buf,' ');
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
  }
  archive_strcat(&mtree->buf,__s);
  sVar5 = strlen(__s);
  __s = __s + sVar5;
LAB_00423351:
  if ((pcVar7 != (char *)0x0) && (sVar5 = strlen(__s), 0x3e < sVar5 + (long)iVar2)) {
    paVar10 = &mtree->buf;
    archive_strncat(paVar10,__s,(long)pcVar7 - (long)__s);
    archive_strncat(paVar10," \\\n",3);
    if (-0x10 < iVar2) {
      iVar12 = 0;
      if (0 < iVar2 + 0xf) {
        iVar12 = iVar2 + 0xf;
      }
      iVar12 = iVar12 + 1;
      do {
        archive_strappend_char(paVar10,' ');
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    __s = pcVar7 + 1;
  }
  archive_strcat(&mtree->buf,__s);
  (mtree->ebuf).length = 0;
  return;
}

Assistant:

static void
mtree_indent(struct mtree_writer *mtree)
{
	int i, fn, nd, pd;
	const char *r, *s, *x;

	if (mtree->classic) {
		if (mtree->indent) {
			nd = 0;
			pd = mtree->depth * 4;
		} else {
			nd = mtree->depth?4:0;
			pd = 0;
		}
	} else
		nd = pd = 0;
	fn = 1;
	s = r = mtree->ebuf.s;
	x = NULL;
	while (*r == ' ')
		r++;
	while ((r = strchr(r, ' ')) != NULL) {
		if (fn) {
			fn = 0;
			for (i = 0; i < nd + pd; i++)
				archive_strappend_char(&mtree->buf, ' ');
			archive_strncat(&mtree->buf, s, r - s);
			if (nd + (r -s) > INDENTNAMELEN) {
				archive_strncat(&mtree->buf, " \\\n", 3);
				for (i = 0; i < (INDENTNAMELEN + 1 + pd); i++)
					archive_strappend_char(&mtree->buf, ' ');
			} else {
				for (i = (int)(r -s + nd);
				    i < (INDENTNAMELEN + 1); i++)
					archive_strappend_char(&mtree->buf, ' ');
			}
			s = ++r;
			x = NULL;
			continue;
		}
		if (pd + (r - s) <= MAXLINELEN - 3 - INDENTNAMELEN)
			x = r++;
		else {
			if (x == NULL)
				x = r;
			archive_strncat(&mtree->buf, s, x - s);
			archive_strncat(&mtree->buf, " \\\n", 3);
			for (i = 0; i < (INDENTNAMELEN + 1 + pd); i++)
				archive_strappend_char(&mtree->buf, ' ');
			s = r = ++x;
			x = NULL;
		}
	}
	if (fn) {
		for (i = 0; i < nd + pd; i++)
			archive_strappend_char(&mtree->buf, ' ');
		archive_strcat(&mtree->buf, s);
		s += strlen(s);
	}
	if (x != NULL && pd + strlen(s) > MAXLINELEN - 3 - INDENTNAMELEN) {
		/* Last keyword is longer. */
		archive_strncat(&mtree->buf, s, x - s);
		archive_strncat(&mtree->buf, " \\\n", 3);
		for (i = 0; i < (INDENTNAMELEN + 1 + pd); i++)
			archive_strappend_char(&mtree->buf, ' ');
		s = ++x;
	}
	archive_strcat(&mtree->buf, s);
	archive_string_empty(&mtree->ebuf);
}